

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op_scalar<ncnn::binary_op_add>(Mat *a,float b,Mat *c,Option *opt)

{
  long *in_RSI;
  long *in_RDI;
  float fVar1;
  int i;
  float *outptr;
  float *ptr;
  int q;
  int size;
  int channels;
  int d;
  int h;
  int w;
  binary_op_add op;
  Mat *m;
  Mat *m_1;
  int local_284;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined4 local_268;
  long local_260;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined8 local_240;
  long local_238;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined4 local_208;
  long local_200;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined8 local_1e0;
  long local_1d8;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  binary_op_add local_1b1 [9];
  long *local_1a8;
  float local_19c;
  long *local_198;
  undefined1 local_18d;
  int local_18c;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined8 *local_168;
  undefined8 *local_158;
  undefined1 local_145;
  int local_144;
  undefined8 *local_138;
  undefined8 *local_128;
  long local_120;
  undefined4 local_114;
  long local_110;
  long local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  long local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_68;
  undefined8 *local_48;
  
  local_1b8 = *(int *)((long)in_RDI + 0x2c);
  local_1bc = (int)in_RDI[6];
  local_1c0 = *(int *)((long)in_RDI + 0x34);
  local_1c4 = (int)in_RDI[7];
  local_1c8 = local_1b8 * local_1bc * local_1c0;
  local_1a8 = in_RSI;
  local_198 = in_RDI;
  for (local_1cc = 0; local_1cc < local_1c4; local_1cc = local_1cc + 1) {
    local_180 = &local_220;
    local_bc = *(int *)((long)local_198 + 0x2c);
    local_c0 = (int)local_198[6];
    local_c4 = *(undefined4 *)((long)local_198 + 0x34);
    local_1d8 = *local_198 + local_198[8] * (long)local_1cc * local_198[2];
    local_d8 = local_198[2];
    local_dc = (undefined4)local_198[3];
    local_e8 = local_198[4];
    local_b8 = &local_220;
    local_a8 = (long)local_bc * (long)local_c0 * local_d8;
    local_178 = &local_220;
    local_168 = &local_220;
    local_138 = &local_280;
    local_f4 = *(int *)((long)local_1a8 + 0x2c);
    local_f8 = (int)local_1a8[6];
    local_fc = *(undefined4 *)((long)local_1a8 + 0x34);
    local_238 = *local_1a8 + local_1a8[8] * (long)local_1cc * local_1a8[2];
    local_110 = local_1a8[2];
    local_114 = (undefined4)local_1a8[3];
    local_120 = local_1a8[4];
    local_f0 = &local_280;
    local_98 = (long)local_f4 * (long)local_f8 * local_110;
    local_128 = &local_280;
    local_158 = &local_280;
    local_1e8 = 0;
    local_1ec = 0;
    local_1f0 = 0;
    local_1f4 = 0;
    local_208 = 0;
    local_210 = 0;
    local_218 = 0;
    local_220 = 0;
    local_9c = 0x10;
    local_ac = 0x10;
    local_144 = local_1cc;
    local_145 = 1;
    local_18c = local_1cc;
    local_18d = 1;
    local_1e0 = 0;
    local_1f8 = 0;
    local_280 = 0;
    local_270 = 0;
    local_268 = 0;
    local_258 = 0;
    local_254 = 0;
    local_250 = 0;
    local_24c = 0;
    local_248 = 0;
    local_240 = 0;
    local_278 = 0;
    local_108 = local_238;
    local_d0 = local_1d8;
    local_68 = local_158;
    local_48 = local_168;
    local_260 = local_120;
    local_200 = local_e8;
    for (local_284 = 0; local_284 < local_1c8; local_284 = local_284 + 1) {
      fVar1 = binary_op_add::operator()
                        (local_1b1,(float *)(local_1d8 + (long)local_284 * 4),&local_19c);
      *(float *)(local_238 + (long)local_284 * 4) = fVar1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar(const Mat& a, float b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        float* outptr = c.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = op(ptr[i], b);
        }
    }

    return 0;
}